

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void __thiscall
bench::save_stats(bench *this,ostream *os,string *name,
                 vector<bench::element,_std::allocator<bench::element>_> *c)

{
  pointer pmVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pcVar4;
  pointer pdVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pointer prVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  size_t *psVar16;
  long lVar17;
  undefined1 *puVar18;
  pointer prVar19;
  pointer prVar20;
  size_t sVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM2 [16];
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_02;
  vector<result,_std::allocator<result>_> line;
  vector<result,_std::allocator<result>_> stats;
  undefined8 local_a8;
  size_type sStack_a0;
  vector<result,_std::allocator<result>_> local_98;
  vector<result,_std::allocator<result>_> local_80;
  long local_68;
  long local_60;
  vector<bench::element,_std::allocator<bench::element>_> *local_58;
  string local_50;
  
  pcVar4 = (name->_M_dataplus)._M_p;
  local_58 = c;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + name->_M_string_length);
  save_header(this,os,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::vector<result,_std::allocator<result>_>::vector
            (&local_80,
             ((long)(this->solvers).
                    super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->solvers).
                    super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) + 1,(allocator_type *)&local_98);
  std::vector<result,_std::allocator<result>_>::vector
            (&local_98,
             ((long)(this->solvers).
                    super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->solvers).
                    super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) + 1,(allocator_type *)&local_a8);
  lVar14 = (long)(this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar14 != 0) {
    local_60 = (lVar14 >> 3) * -0x3333333333333333;
    lVar14 = 0;
    local_68 = 0;
    do {
      lVar17 = local_68;
      if ((long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        pdVar5 = (this->array).m_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        psVar16 = &(local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_start)->rank;
        sVar21 = 0;
        do {
          ((result *)(psVar16 + -2))->value =
               *(double *)((long)pdVar5 + sVar21 * 8 + (this->array).m_line_size * lVar14);
          psVar16[-1] = sVar21;
          *psVar16 = 0;
          sVar21 = sVar21 + 1;
          psVar16 = psVar16 + 3;
        } while (((long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - sVar21 != 0);
      }
      sVar21 = (long)(this->solvers).
                     super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->solvers).
                     super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
      local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar21].value =
           (local_58->super__Vector_base<bench::element,_std::allocator<bench::element>_>)._M_impl.
           super__Vector_impl_data._M_start[local_68].solution;
      local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar21].position = sVar21;
      local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar21].rank = 0;
      prVar19 = local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start;
      sort_on_value<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>>
                ((__normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_>)
                 local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<result_*,_std::vector<result,_std::allocator<result>_>_>)
                 local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_68].m_objective_type);
      prVar12 = local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_finish;
      prVar20 = local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start;
      (local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start)->rank = 1;
      lVar13 = ((long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if ((long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start != 0x18) {
        lVar15 = lVar13 + -1;
        psVar16 = &local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                   super__Vector_impl_data._M_start[1].rank;
        sVar21 = 1;
        do {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = ((result *)(psVar16 + -2))->value;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = psVar16[-5];
          uVar6 = vcmpsd_avx512f(auVar22,auVar2,4);
          prVar19 = (pointer)CONCAT44((int)((ulong)prVar19 >> 0x20),(uint)((ushort)uVar6 & 1));
          sVar21 = (long)&prVar19->value + sVar21;
          *psVar16 = sVar21;
          psVar16 = psVar16 + 3;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      if (local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
          super__Vector_impl_data._M_start) {
        psVar16 = &(local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_start)->rank;
        lVar15 = lVar13;
        do {
          local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
          super__Vector_impl_data._M_start[psVar16[-1]].rank =
               local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_start[psVar16[-1]].rank + *psVar16;
          psVar16 = psVar16 + 3;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      if (local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar13) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (prVar20,prVar12);
      }
      pmVar1 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar17;
      local_a8 = (pmVar1->m_name)._M_dataplus;
      sStack_a0 = (pmVar1->m_name)._M_string_length;
      format_str.size_ = 2;
      format_str.data_ = "{}";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_a8;
      args.desc_ = 0xd;
      ::fmt::v7::vprint<char>(os,format_str,args);
      if ((long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar17 = ((long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar13 = 0x10;
        do {
          local_a8 = *(undefined8 *)
                      ((long)&(local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                               super__Vector_impl_data._M_start)->value + lVar13);
          format_str_00.size_ = 3;
          format_str_00.data_ = ",{}";
          args_00.field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_a8;
          args_00.desc_ = 4;
          ::fmt::v7::vprint<char>(os,format_str_00,args_00);
          lVar13 = lVar13 + 0x18;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      local_a8 = 0;
      format_str_01.size_ = 1;
      format_str_01.data_ = "\n";
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&local_a8;
      ::fmt::v7::vprint<char>
                (os,format_str_01,
                 (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  )(auVar7 << 0x40));
      local_68 = local_68 + 1;
      lVar14 = lVar14 + 8;
    } while (local_68 != local_60);
  }
  local_a8 = 0;
  format_str_02.size_ = 4;
  format_str_02.data_ = "mean";
  auVar8._8_8_ = 0;
  auVar8._0_8_ = &local_a8;
  ::fmt::v7::vprint<char>
            (os,format_str_02,
             (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              )(auVar8 << 0x40));
  lVar14 = (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar14 != 0) {
    lVar13 = 0;
    lVar17 = 0;
    do {
      auVar2 = vcvtusi2sd_avx512f(in_XMM2,((long)(this->models).
                                                 super__Vector_base<bench::model,_std::allocator<bench::model>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->models).
                                                 super__Vector_base<bench::model,_std::allocator<bench::model>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                          -0x3333333333333333);
      auVar22 = vcvtusi2sd_avx512f(in_XMM2,*(undefined8 *)
                                            ((long)&(local_80.
                                                  super__Vector_base<result,_std::allocator<result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rank +
                                            lVar13));
      *(double *)
       ((long)&(local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                super__Vector_impl_data._M_start)->value + lVar13) = auVar22._0_8_ / auVar2._0_8_;
      *(long *)((long)&(local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                        super__Vector_impl_data._M_start)->position + lVar13) = lVar17;
      local_a8 = *(undefined8 *)
                  ((long)&(local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                           super__Vector_impl_data._M_start)->value + lVar13);
      format_str_03.size_ = 3;
      format_str_03.data_ = ",{}";
      args_01.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_a8;
      args_01.desc_ = 10;
      ::fmt::v7::vprint<char>(os,format_str_03,args_01);
      lVar17 = lVar17 + 1;
      lVar13 = lVar13 + 0x18;
    } while ((lVar14 >> 3) * -0x5555555555555555 - lVar17 != 0);
  }
  local_a8 = 0;
  format_str_04.size_ = 1;
  format_str_04.data_ = "\n";
  auVar9._8_8_ = 0;
  auVar9._0_8_ = &local_a8;
  prVar19 = (pointer)os;
  ::fmt::v7::vprint<char>
            (os,format_str_04,
             (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              )(auVar9 << 0x40));
  prVar12 = local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_finish;
  prVar20 = local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (int)LZCOUNT(((long)local_80.super__Vector_base<result,_std::allocator<result>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_80.super__Vector_base<result,_std::allocator<result>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (prVar20,prVar12);
    prVar19 = prVar20;
  }
  prVar12 = local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_finish;
  prVar20 = local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_start;
  (local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
  _M_start)->rank = 1;
  lVar14 = ((long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_start != 0x18) {
    lVar17 = lVar14 + -1;
    psVar16 = &local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_start[1].rank;
    puVar18 = (undefined1 *)0x1;
    do {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = ((result *)(psVar16 + -2))->value;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = psVar16[-5];
      uVar6 = vcmpsd_avx512f(auVar23,auVar3,4);
      prVar19 = (pointer)CONCAT44((int)((ulong)prVar19 >> 0x20),(uint)((ushort)uVar6 & 1));
      puVar18 = (undefined1 *)((long)&prVar19->value + (long)puVar18);
      *psVar16 = (size_t)puVar18;
      psVar16 = psVar16 + 3;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  if (local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_3_>>
              (local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
               super__Vector_impl_data._M_finish,(int)LZCOUNT(lVar14) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<result*,std::vector<result,std::allocator<result>>>,__gnu_cxx::__ops::_Iter_comp_iter<bench::save_stats(std::ostream&,std::__cxx11::string,std::vector<bench::element,std::allocator<bench::element>>const&)::_lambda(auto:1_const&,auto:2_const&)_3_>>
              (prVar20,prVar12);
  }
  local_a8 = 0;
  format_str_05.size_ = 4;
  format_str_05.data_ = "rank";
  auVar10._8_8_ = 0;
  auVar10._0_8_ = &local_a8;
  ::fmt::v7::vprint<char>
            (os,format_str_05,
             (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              )(auVar10 << 0x40));
  if ((long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar14 = ((long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar17 = 0x10;
    do {
      local_a8 = *(undefined8 *)
                  ((long)&(local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                           super__Vector_impl_data._M_start)->value + lVar17);
      format_str_06.size_ = 3;
      format_str_06.data_ = ",{}";
      args_02.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_a8;
      args_02.desc_ = 4;
      ::fmt::v7::vprint<char>(os,format_str_06,args_02);
      lVar17 = lVar17 + 0x18;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  local_a8 = 0;
  format_str_07.size_ = 1;
  format_str_07.data_ = "\n";
  auVar11._8_8_ = 0;
  auVar11._0_8_ = &local_a8;
  ::fmt::v7::vprint<char>
            (os,format_str_07,
             (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              )(auVar11 << 0x40));
  if (local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start != (result *)0x0) {
    operator_delete(local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<result,_std::allocator<result>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void save_stats(std::ostream& os,
                    std::string name,
                    const std::vector<element>& c)
    {
        save_header(os, name);

        std::vector<result> stats(solvers.size() + 1);
        std::vector<result> line(solvers.size() + 1);

        for (size_t i{ 0 }, e{ models.size() }; i != e; ++i) {
            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                line[j] = { array(i, j), j };
            line[solvers.size()] = { c[i].solution, solvers.size() };

            sort_on_value(
              std::begin(line), std::end(line), models[i].objective_type());

            size_t rank = 1;
            line[0].rank = rank;

            // values: 7 7 9 10 11 11
            // ranks:  1 1 2  3  4  4
            // but maybe we want:
            // ranks:  1 1 3  4  5  5

            for (size_t j = { 1 }, end_j{ line.size() }; j != end_j; ++j) {
                if (line[j].value != line[j - 1].value)
                    ++rank;

                line[j].rank = rank;
            }

            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                stats[line[j].position].rank += line[j].rank;

            std::sort(std::begin(line),
                      std::end(line),
                      [](const auto& lhs, const auto& rhs) {
                          return lhs.position < rhs.position;
                      });

            fmt::print(os, "{}", models[i].name());
            for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j)
                fmt::print(os, ",{}", line[j].rank);
            fmt::print(os, "\n");
        }

        fmt::print(os, "mean");
        for (size_t j{ 0 }, end_j{ line.size() }; j != end_j; ++j) {
            stats[j].value = static_cast<double>(stats[j].rank) /
                             static_cast<double>(models.size());
            stats[j].position = j;

            fmt::print(os, ",{}", stats[j].value);
        }
        fmt::print(os, "\n");

        std::sort(std::begin(stats),
                  std::end(stats),
                  [](const auto& lhs, const auto& rhs) {
                      return lhs.value < rhs.value;
                  });

        size_t rank = 1;
        stats[0].rank = rank;

        for (size_t i{ 1 }, e = stats.size(); i != e; ++i) {
            if (stats[i].value != stats[i - 1].value)
                ++rank;

            stats[i].rank = rank;
        }

        std::sort(std::begin(stats),
                  std::end(stats),
                  [](const auto& lhs, const auto& rhs) {
                      return lhs.position < rhs.position;
                  });

        fmt::print(os, "rank");
        for (size_t i{ 0 }, e = stats.size(); i != e; ++i)
            fmt::print(os, ",{}", stats[i].rank);
        fmt::print(os, "\n");
    }